

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cpp
# Opt level: O1

void ixy::remove_driver(string *pci_addr)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  path path;
  ofstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  path local_238;
  undefined1 local_210 [8];
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  std::operator+(&local_258,"/sys/bus/pci/devices/",pci_addr);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_258);
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 == paVar2) {
    local_200._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_200._8_8_ = plVar1[3];
    local_210 = (undefined1  [8])&local_200;
  }
  else {
    local_200._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_210 = (undefined1  [8])*plVar1;
  }
  local_208 = plVar1[1];
  *plVar1 = (long)paVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::filesystem::__cxx11::path::path(&local_238,(string_type *)local_210,auto_format);
  if (local_210 != (undefined1  [8])&local_200) {
    operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_210,local_238._M_pathname._M_dataplus._M_p,_S_out);
  if ((abStack_1f0[*(long *)((long)local_210 + -0x18)] & 5) == 0) {
    std::ostream::write(local_210,(long)(pci_addr->_M_dataplus)._M_p);
    if ((abStack_1f0[*(long *)((long)local_210 + -0x18)] & 5) != 0) {
      local_258._M_string_length = 0x10dd7f;
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp"
                 ,0x18,"remove_driver",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_258);
    }
    std::ofstream::close();
  }
  else {
    local_258._M_string_length = 0x10dd6e;
    debug<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp",
               0x13,"remove_driver",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_258);
  }
  local_210 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18)) = __M_split_cmpts;
  std::filebuf::~filebuf((filebuf *)&local_208);
  std::ios_base::~ios_base(local_118);
  std::filesystem::__cxx11::path::~path(&local_238);
  return;
}

Assistant:

void remove_driver(const std::string &pci_addr) {
    fs::path path{"/sys/bus/pci/devices/" + pci_addr + "/driver/unbind"};
    auto s = std::ofstream(path, std::ofstream::out);
    if (!s) {
        debug("no driver loaded");
        return;
    }
    s.write(pci_addr.c_str(), pci_addr.length());
    if (!s) {
        error("failed to unload driver for device");
    }
    s.close();
}